

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImFontAtlasBuildFinish(ImFontAtlas *atlas)

{
  uint *puVar1;
  float *pfVar2;
  float fVar3;
  float y0;
  ImVec2 IVar4;
  ushort uVar5;
  ushort uVar6;
  int iVar7;
  uchar *puVar8;
  long lVar9;
  ImFont *pIVar10;
  undefined1 auVar11 [16];
  bool bVar12;
  int iVar13;
  ImFontAtlasCustomRect *pIVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint *puVar18;
  bool bVar19;
  uint uVar20;
  int iVar21;
  size_t __n;
  int iVar22;
  long lVar23;
  long lVar24;
  uint uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 in_ZMM5 [64];
  size_t local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  ulong local_48;
  ImFontAtlasCustomRect *local_40;
  ulong local_38;
  
  if ((atlas->TexPixelsAlpha8 == (uchar *)0x0) && (atlas->TexPixelsRGBA32 == (uint *)0x0)) {
    __assert_fail("atlas->TexPixelsAlpha8 != __null || atlas->TexPixelsRGBA32 != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                  ,0xa1d,"void ImFontAtlasBuildFinish(ImFontAtlas *)");
  }
  pIVar14 = ImFontAtlas::GetCustomRectByIndex(atlas,atlas->PackIdMouseCursors);
  uVar5 = pIVar14->X;
  if (uVar5 == 0xffff) {
    __assert_fail("r->IsPacked()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                  ,0x9ac,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
  }
  if ((atlas->Flags & 2) == 0) {
    if ((pIVar14->Width != 0xd9) || (pIVar14->Height != 0x1b)) {
      __assert_fail("r->Width == FONT_ATLAS_DEFAULT_TEX_DATA_W * 2 + 1 && r->Height == FONT_ATLAS_DEFAULT_TEX_DATA_H"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                    ,0x9b2,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
    }
    if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
      ImFontAtlasBuildRender32bppRectFromString
                (atlas,(uint)uVar5,(uint)pIVar14->Y,0x6c,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                 ,'.',0xffffffff);
      ImFontAtlasBuildRender32bppRectFromString
                (atlas,uVar5 + 0x6d,(uint)pIVar14->Y,0x6c,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                 ,'X',0xffffffff);
    }
    else {
      ImFontAtlasBuildRender8bppRectFromString
                (atlas,(uint)uVar5,(uint)pIVar14->Y,0x6c,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                 ,'.',0xff);
      ImFontAtlasBuildRender8bppRectFromString
                (atlas,uVar5 + 0x6d,(uint)pIVar14->Y,0x6c,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                 ,'X',0xff);
    }
  }
  else {
    if ((pIVar14->Width != 2) || (pIVar14->Height != 2)) {
      __assert_fail("r->Width == 2 && r->Height == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                    ,0x9c3,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
    }
    iVar22 = atlas->TexWidth;
    iVar13 = (uint)pIVar14->Y * iVar22 + (uint)uVar5;
    if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
      puVar18 = atlas->TexPixelsRGBA32;
      puVar1 = puVar18 + (iVar22 + iVar13);
      puVar1[0] = 0xffffffff;
      puVar1[1] = 0xffffffff;
      puVar18 = puVar18 + iVar13;
      puVar18[0] = 0xffffffff;
      puVar18[1] = 0xffffffff;
    }
    else {
      atlas->TexPixelsAlpha8[(long)(iVar22 + iVar13) + 1] = 0xff;
      atlas->TexPixelsAlpha8[iVar22 + iVar13] = 0xff;
      atlas->TexPixelsAlpha8[(long)iVar13 + 1] = 0xff;
      atlas->TexPixelsAlpha8[iVar13] = 0xff;
    }
  }
  uVar17._0_2_ = pIVar14->X;
  uVar17._2_2_ = pIVar14->Y;
  auVar11 = vpmovzxwd_avx(ZEXT416(uVar17));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar26._0_4_ = (atlas->TexUvScale).x * (auVar11._0_4_ + 0.5);
  auVar26._4_4_ = (atlas->TexUvScale).y * (auVar11._4_4_ + 0.5);
  auVar26._8_4_ = (auVar11._8_4_ + 0.5) * 0.0;
  auVar26._12_4_ = (auVar11._12_4_ + 0.5) * 0.0;
  IVar4 = (ImVec2)vmovlps_avx(auVar26);
  atlas->TexUvWhitePixel = IVar4;
  if ((atlas->Flags & 4) == 0) {
    local_40 = ImFontAtlas::GetCustomRectByIndex(atlas,atlas->PackIdLines);
    uVar5 = local_40->X;
    if (uVar5 == 0xffff) {
      __assert_fail("r->IsPacked()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                    ,0x9d8,"void ImFontAtlasBuildRenderLinesTexData(ImFontAtlas *)");
    }
    local_60 = 0;
    lVar24 = -0x40;
    iVar22 = 0;
    uVar16 = 0;
    do {
      uVar17 = (uint)uVar5;
      if ((ulong)local_40->Height <= lVar24 + 0x40U) {
        __assert_fail("pad_left + line_width + pad_right == r->Width && y < r->Height",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                      ,0x9e2,"void ImFontAtlasBuildRenderLinesTexData(ImFontAtlas *)");
      }
      uVar5 = local_40->Width;
      uVar15 = (int)uVar16 + (uint)uVar5;
      uVar25 = uVar15 >> 1;
      iVar13 = (int)lVar24;
      uVar20 = iVar13 + uVar25 + 0x40;
      iVar21 = (uVar5 - uVar25) + (int)uVar16;
      puVar8 = atlas->TexPixelsAlpha8;
      local_38 = uVar16;
      if (puVar8 == (uchar *)0x0) {
        puVar18 = atlas->TexPixelsRGBA32;
        uVar6 = local_40->Y;
        iVar7 = atlas->TexWidth;
        puVar1 = puVar18 + ((iVar13 + (uint)uVar6 + 0x40) * iVar7 + uVar17);
        if (1 < uVar15) {
          memset(puVar1,0,(ulong)(uVar25 + (uVar25 == 0)) << 2);
        }
        if (lVar24 != -0x40) {
          memset(puVar1 + uVar25,0xff,local_60);
        }
        if (uVar20 != uVar5) {
          puVar18 = puVar18 + (ulong)(iVar7 * ((uint)uVar6 + iVar22) + uVar17) +
                              (ulong)uVar25 + lVar24 + 0x40;
          __n = (ulong)(iVar21 + (uint)(iVar21 == 0)) << 2;
          goto LAB_0018f7ec;
        }
      }
      else {
        uVar6 = local_40->Y;
        local_48 = (ulong)uVar6;
        iVar7 = atlas->TexWidth;
        if (1 < uVar15) {
          memset(puVar8 + ((iVar13 + (uint)uVar6 + 0x40) * iVar7 + uVar17),0,
                 (ulong)(uVar25 + (uVar25 == 0)));
        }
        if (lVar24 != -0x40) {
          memset(puVar8 + ((iVar13 + (uint)uVar6 + 0x40) * iVar7 + uVar17) + uVar25,0xff,
                 lVar24 + 0x40U);
        }
        if (uVar20 != uVar5) {
          puVar18 = (uint *)(puVar8 + lVar24 + (ulong)(iVar7 * ((int)local_48 + iVar22) + uVar17) +
                                               (ulong)uVar25 + 0x40);
          __n = (size_t)(iVar21 + (uint)(iVar21 == 0));
LAB_0018f7ec:
          memset(puVar18,0,__n);
        }
      }
      uVar5 = local_40->X;
      auVar27._0_4_ = (float)((uVar25 + uVar5) - 1);
      auVar27._4_12_ = in_ZMM5._4_12_;
      auVar28._0_4_ = (float)(iVar13 + uVar25 + uVar5 + 0x41);
      auVar28._4_12_ = in_ZMM5._4_12_;
      fVar3 = (atlas->TexUvScale).y;
      auVar11 = vinsertps_avx(ZEXT416((uint)(atlas->TexUvScale).x),
                              ZEXT416((uint)(fVar3 * (float)(int)(iVar13 + (uint)local_40->Y + 0x40)
                                            + fVar3 * (float)(int)(iVar13 + 0x41 + (uint)local_40->Y
                                                                  ))),0x10);
      auVar26 = vinsertps_avx(auVar27,SUB6416(ZEXT464(0x3f000000),0),0x10);
      auVar26 = vinsertps_avx(auVar26,auVar28,0x20);
      auVar26 = vinsertps_avx(auVar26,SUB6416(ZEXT464(0x3f000000),0),0x30);
      pfVar2 = &atlas->TexUvLines[0].x + local_60;
      *pfVar2 = auVar11._0_4_ * auVar26._0_4_;
      pfVar2[1] = auVar11._4_4_ * auVar26._4_4_;
      pfVar2[2] = auVar11._0_4_ * auVar26._8_4_;
      pfVar2[3] = auVar11._4_4_ * auVar26._12_4_;
      uVar16 = (ulong)((int)local_38 - 1);
      iVar22 = iVar22 + 1;
      local_60 = local_60 + 4;
      lVar24 = lVar24 + 1;
    } while (lVar24 != 0);
  }
  iVar22 = (atlas->CustomRects).Size;
  if (0 < iVar22) {
    lVar24 = 0;
    lVar23 = 0;
    do {
      pIVar14 = (atlas->CustomRects).Data;
      lVar9 = *(long *)((long)&pIVar14->Font + lVar24);
      if ((lVar9 != 0) && (*(int *)((long)&pIVar14->GlyphID + lVar24) != 0)) {
        if (*(ImFontAtlas **)(lVar9 + 0x40) != atlas) {
          __assert_fail("r->Font->ContainerAtlas == atlas",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                        ,0xa29,"void ImFontAtlasBuildFinish(ImFontAtlas *)");
        }
        local_50.x = 0.0;
        local_50.y = 0.0;
        local_58.x = 0.0;
        local_58.y = 0.0;
        ImFontAtlas::CalcCustomRectUV
                  (atlas,(ImFontAtlasCustomRect *)((long)&pIVar14->Width + lVar24),&local_50,
                   &local_58);
        fVar3 = *(float *)((long)&(pIVar14->GlyphOffset).x + lVar24);
        y0 = *(float *)((long)&(pIVar14->GlyphOffset).y + lVar24);
        ImFont::AddGlyph(*(ImFont **)((long)&pIVar14->Font + lVar24),(ImFontConfig *)0x0,
                         *(ImWchar *)((long)&pIVar14->GlyphID + lVar24),fVar3,y0,
                         fVar3 + (float)*(ushort *)((long)&pIVar14->Width + lVar24),
                         y0 + (float)*(ushort *)((long)&pIVar14->Height + lVar24),local_50.x,
                         local_50.y,local_58.x,local_58.y,
                         *(float *)((long)&pIVar14->GlyphAdvanceX + lVar24));
        iVar22 = (atlas->CustomRects).Size;
      }
      lVar23 = lVar23 + 1;
      lVar24 = lVar24 + 0x20;
    } while (lVar23 < iVar22);
  }
  uVar17 = (atlas->Fonts).Size;
  if (0 < (int)uVar17) {
    lVar24 = 0;
    do {
      pIVar10 = (atlas->Fonts).Data[lVar24];
      if (pIVar10->DirtyLookupTables == true) {
        ImFont::BuildLookupTable(pIVar10);
        uVar17 = (atlas->Fonts).Size;
      }
      lVar24 = lVar24 + 1;
    } while (lVar24 < (int)uVar17);
    if (0 < (int)uVar17) {
      uVar16 = 0;
      do {
        if ((long)(atlas->Fonts).Size <= (long)uVar16) {
          __assert_fail("i >= 0 && i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.h"
                        ,0x66a,"T &ImVector<ImFont *>::operator[](int) [T = ImFont *]");
        }
        pIVar10 = (atlas->Fonts).Data[uVar16];
        if (pIVar10->EllipsisChar == 0xffff) {
          lVar24 = 0;
          bVar12 = true;
          do {
            bVar19 = bVar12;
            uVar5 = (&DAT_001f1828)[lVar24];
            if ((((ulong)uVar5 < (ulong)(long)(pIVar10->IndexLookup).Size) &&
                ((pIVar10->IndexLookup).Data[uVar5] != 0xffff)) &&
               ((pIVar10->Glyphs).Data != (ImFontGlyph *)0x0)) {
              pIVar10->EllipsisChar = uVar5;
              break;
            }
            lVar24 = 1;
            bVar12 = false;
          } while (bVar19);
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 != uVar17);
    }
  }
  return;
}

Assistant:

void ImFontAtlasBuildFinish(ImFontAtlas* atlas)
{
    // Render into our custom data blocks
    IM_ASSERT(atlas->TexPixelsAlpha8 != NULL || atlas->TexPixelsRGBA32 != NULL);
    ImFontAtlasBuildRenderDefaultTexData(atlas);
    ImFontAtlasBuildRenderLinesTexData(atlas);

    // Register custom rectangle glyphs
    for (int i = 0; i < atlas->CustomRects.Size; i++)
    {
        const ImFontAtlasCustomRect* r = &atlas->CustomRects[i];
        if (r->Font == NULL || r->GlyphID == 0)
            continue;

        // Will ignore ImFontConfig settings: GlyphMinAdvanceX, GlyphMinAdvanceY, GlyphExtraSpacing, PixelSnapH
        IM_ASSERT(r->Font->ContainerAtlas == atlas);
        ImVec2 uv0, uv1;
        atlas->CalcCustomRectUV(r, &uv0, &uv1);
        r->Font->AddGlyph(NULL, (ImWchar)r->GlyphID, r->GlyphOffset.x, r->GlyphOffset.y, r->GlyphOffset.x + r->Width, r->GlyphOffset.y + r->Height, uv0.x, uv0.y, uv1.x, uv1.y, r->GlyphAdvanceX);
    }

    // Build all fonts lookup tables
    for (int i = 0; i < atlas->Fonts.Size; i++)
        if (atlas->Fonts[i]->DirtyLookupTables)
            atlas->Fonts[i]->BuildLookupTable();

    // Ellipsis character is required for rendering elided text. We prefer using U+2026 (horizontal ellipsis).
    // However some old fonts may contain ellipsis at U+0085. Here we auto-detect most suitable ellipsis character.
    // FIXME: Also note that 0x2026 is currently seldom included in our font ranges. Because of this we are more likely to use three individual dots.
    for (int i = 0; i < atlas->Fonts.size(); i++)
    {
        ImFont* font = atlas->Fonts[i];
        if (font->EllipsisChar != (ImWchar)-1)
            continue;
        const ImWchar ellipsis_variants[] = { (ImWchar)0x2026, (ImWchar)0x0085 };
        for (int j = 0; j < IM_ARRAYSIZE(ellipsis_variants); j++)
            if (font->FindGlyphNoFallback(ellipsis_variants[j]) != NULL) // Verify glyph exists
            {
                font->EllipsisChar = ellipsis_variants[j];
                break;
            }
    }
}